

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O2

BOOL CopyFileW(LPCWSTR lpExistingFileName,LPCWSTR lpNewFileName,BOOL bFailIfExists)

{
  long lVar1;
  BOOL BVar2;
  DWORD DVar3;
  size_t sVar4;
  char *lpMultiByteStr;
  char *lpMultiByteStr_00;
  int *piVar5;
  int iVar6;
  int iVar7;
  long in_FS_OFFSET;
  undefined1 local_b8 [8];
  PathCharString destPathString;
  PathCharString sourcePathString;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  destPathString._32_8_ = local_b8;
  destPathString.m_size = 0;
  if (!PAL_InitializeChakraCoreCalled) goto LAB_0012246e;
  CorUnix::InternalGetCurrentThread();
  if (lpExistingFileName == (LPCWSTR)0x0) {
    iVar7 = 0;
  }
  else {
    sVar4 = PAL_wcslen(lpExistingFileName);
    iVar7 = ((int)sVar4 + 1) * MaxWCharToAcpLengthFactor;
  }
  lpMultiByteStr =
       StackString<32UL,_char>::OpenStringBuffer
                 ((StackString<32UL,_char> *)&destPathString.m_count,(long)iVar7);
  iVar6 = 8;
  if (lpMultiByteStr == (char *)0x0) {
LAB_00122421:
    piVar5 = __errno_location();
    *piVar5 = iVar6;
    BVar2 = 0;
  }
  else {
    iVar7 = WideCharToMultiByte(0,0,lpExistingFileName,-1,lpMultiByteStr,iVar7,(LPCSTR)0x0,
                                (LPBOOL)0x0);
    destPathString.m_count._0_1_ = 0;
    if (iVar7 == 0) {
      DVar3 = GetLastError();
      if (DVar3 == 0x7a) {
LAB_001223c6:
        iVar6 = 0xce;
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012246e;
      }
      else {
        fprintf(_stderr,"] %s %s:%d","CopyFileW",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
                ,0x459);
        iVar6 = 0x54f;
        fprintf(_stderr,"WideCharToMultiByte failure! error is %d\n",(ulong)DVar3);
      }
      goto LAB_00122421;
    }
    if (lpNewFileName == (LPCWSTR)0x0) {
      iVar7 = 0;
    }
    else {
      sVar4 = PAL_wcslen(lpNewFileName);
      iVar7 = ((int)sVar4 + 1) * MaxWCharToAcpLengthFactor;
    }
    lpMultiByteStr_00 =
         StackString<32UL,_char>::OpenStringBuffer((StackString<32UL,_char> *)local_b8,(long)iVar7);
    if (lpMultiByteStr_00 == (char *)0x0) goto LAB_00122421;
    iVar7 = WideCharToMultiByte(0,0,lpNewFileName,-1,lpMultiByteStr_00,iVar7,(LPCSTR)0x0,(LPBOOL)0x0
                               );
    if ((ulong)(long)iVar7 < destPathString.m_size) {
      destPathString.m_size = (long)iVar7;
    }
    *(undefined1 *)(destPathString._32_8_ + destPathString.m_size) = 0;
    if (iVar7 == 0) {
      DVar3 = GetLastError();
      if (DVar3 == 0x7a) goto LAB_001223c6;
      fprintf(_stderr,"] %s %s:%d","CopyFileW",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
              ,0x479);
      iVar6 = 0x54f;
      fprintf(_stderr,"WideCharToMultiByte failure! error is %d\n",(ulong)DVar3);
      goto LAB_00122421;
    }
    BVar2 = CopyFileA(lpMultiByteStr,lpMultiByteStr_00,bFailIfExists);
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)local_b8);
    StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)&destPathString.m_count);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return BVar2;
    }
    __stack_chk_fail();
  }
LAB_0012246e:
  abort();
}

Assistant:

BOOL
PALAPI
CopyFileW(
      IN LPCWSTR lpExistingFileName,
      IN LPCWSTR lpNewFileName,
      IN BOOL bFailIfExists)
{
    CPalThread *pThread;
    PathCharString sourcePathString;
    PathCharString destPathString;
    char * source;
    char * dest;
    int src_size, dest_size, length = 0;
    BOOL bRet = FALSE;

    PERF_ENTRY(CopyFileW);
    ENTRY("CopyFileW(lpExistingFileName=%p (%S), lpNewFileName=%p (%S), bFailIfExists=%d)\n",
          lpExistingFileName?lpExistingFileName:W16_NULLSTRING,
          lpExistingFileName?lpExistingFileName:W16_NULLSTRING,
          lpNewFileName?lpNewFileName:W16_NULLSTRING,
          lpNewFileName?lpNewFileName:W16_NULLSTRING, bFailIfExists);

    pThread = InternalGetCurrentThread();
    if (lpExistingFileName != NULL)
    {
        length = (PAL_wcslen(lpExistingFileName)+1) * MaxWCharToAcpLengthFactor;
    }
    
    source = sourcePathString.OpenStringBuffer(length);
    if (NULL == source)
    {
        pThread->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        goto done;
    }

    src_size = WideCharToMultiByte( CP_ACP, 0, lpExistingFileName, -1, source, length,
                                NULL, NULL );
    sourcePathString.CloseBuffer(src_size);
    
    if( src_size == 0 )
    {
        DWORD dwLastError = GetLastError();
        if( dwLastError == ERROR_INSUFFICIENT_BUFFER )
        {
            WARN("lpExistingFileName is larger than MAX_LONGPATH (%d)!\n", MAX_LONGPATH);
            pThread->SetLastError(ERROR_FILENAME_EXCED_RANGE);
        }
        else
        {
            ASSERT("WideCharToMultiByte failure! error is %d\n", dwLastError);
            pThread->SetLastError(ERROR_INTERNAL_ERROR);
        }
        goto done;
    }

    length = 0;
    if (lpNewFileName != NULL)
    {
        length = (PAL_wcslen(lpNewFileName)+1) * MaxWCharToAcpLengthFactor;
    }
    
    dest = destPathString.OpenStringBuffer(length);
    if (NULL == dest)
    {
        pThread->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        goto done;
    }
    dest_size = WideCharToMultiByte( CP_ACP, 0, lpNewFileName, -1, dest, length,
                                NULL, NULL );
    destPathString.CloseBuffer(dest_size);
    
    if( dest_size == 0 )
    {
        DWORD dwLastError = GetLastError();
        if( dwLastError == ERROR_INSUFFICIENT_BUFFER )
        {
            WARN("lpNewFileName is larger than MAX_LONGPATH (%d)!\n", MAX_LONGPATH);
            pThread->SetLastError(ERROR_FILENAME_EXCED_RANGE);
        }
        else
        {
            ASSERT("WideCharToMultiByte failure! error is %d\n", dwLastError);
            pThread->SetLastError(ERROR_INTERNAL_ERROR);
        }
        goto done;
    }

    bRet = CopyFileA(source,dest,bFailIfExists);

done:
    LOGEXIT("CopyFileW returns BOOL %d\n", bRet);
    PERF_EXIT(CopyFileW);
    return bRet;
}